

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::DielectricInterfaceBxDF::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DielectricInterfaceBxDF *this)

{
  SampledSpectrum *in_R9;
  string sStack_38;
  
  TrowbridgeReitzDistribution::ToString_abi_cxx11_(&sStack_38,&this->mfDistrib);
  StringPrintf<float_const&,std::__cxx11::string,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ DielectricInterfaceBxDF eta: %f mfDistrib: %s tint: %s ]",(char *)this,
             (float *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->tint,in_R9)
  ;
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string DielectricInterfaceBxDF::ToString() const {
    return StringPrintf("[ DielectricInterfaceBxDF eta: %f mfDistrib: %s tint: %s ]", eta,
                        mfDistrib.ToString(), tint);
}